

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

int __thiscall lzham::lzcompressor::init(lzcompressor *this,EVP_PKEY_CTX *ctx)

{
  compression_level cVar1;
  task_pool *ptVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  raw_parse_thread_state *prVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  state *this_00;
  ulong uVar11;
  bool bVar12;
  
  clear(this);
  if (*(int *)(ctx + 0x10) - 0x1eU < 0xfffffff1) {
    return 0;
  }
  if (5 < *(uint *)(ctx + 0xc)) {
    return 0;
  }
  uVar3 = *(undefined8 *)(ctx + 8);
  uVar4 = *(undefined8 *)(ctx + 0x10);
  uVar5 = *(undefined8 *)(ctx + 0x18);
  (this->m_params).m_pTask_pool = *(task_pool **)ctx;
  (this->m_params).m_max_helper_threads = (int)uVar3;
  (this->m_params).m_compression_level = (int)((ulong)uVar3 >> 0x20);
  (this->m_params).m_lzham_compress_flags = *(uint *)(ctx + 0x20);
  (this->m_params).m_dict_size_log2 = (int)uVar4;
  (this->m_params).m_block_size = (int)((ulong)uVar4 >> 0x20);
  (this->m_params).m_num_cachelines = (int)uVar5;
  (this->m_params).m_cacheline_size = (int)((ulong)uVar5 >> 0x20);
  ptVar2 = (this->m_params).m_pTask_pool;
  if ((ptVar2 == (task_pool *)0x0) || (ptVar2->m_num_threads == 0)) {
    bVar12 = false;
  }
  else {
    bVar12 = (this->m_params).m_max_helper_threads != 0;
  }
  this->m_use_task_pool = bVar12;
  if ((this->m_params).m_max_helper_threads != 0 && bVar12 == false) {
    return 0;
  }
  uVar3 = *(undefined8 *)(s_settings + (ulong)*(uint *)(ctx + 0xc) * 0x10);
  uVar4 = *(undefined8 *)(s_settings + (ulong)*(uint *)(ctx + 0xc) * 0x10 + 8);
  (this->m_settings).m_fast_bytes = (int)uVar3;
  (this->m_settings).m_fast_adaptive_huffman_updating = (bool)(char)((ulong)uVar3 >> 0x20);
  (this->m_settings).m_use_polar_codes = (bool)(char)((ulong)uVar3 >> 0x28);
  *(short *)&(this->m_settings).field_0x6 = (short)((ulong)uVar3 >> 0x30);
  (this->m_settings).m_match_accel_max_matches_per_probe = (int)uVar4;
  (this->m_settings).m_match_accel_max_probes = (int)((ulong)uVar4 >> 0x20);
  uVar9 = (this->m_params).m_lzham_compress_flags;
  if ((uVar9 & 1) != 0) {
    (this->m_settings).m_use_polar_codes = true;
  }
  uVar8 = (uint)(1 << ((byte)(this->m_params).m_dict_size_log2 & 0x1f)) >> 3;
  uVar10 = (this->m_params).m_block_size;
  if (uVar8 < uVar10) {
    (this->m_params).m_block_size = uVar8;
    uVar10 = uVar8;
  }
  this->m_num_parse_threads = 1;
  uVar8 = *(uint *)(ctx + 8);
  if (uVar8 != 0) {
    if (uVar10 < 0x4000) {
      uVar10 = 8;
      if (uVar8 + 1 < 8) {
        uVar10 = uVar8 + 1;
      }
    }
    else {
      if ((uVar8 == 1) ||
         (cVar1 = (this->m_params).m_compression_level, cVar1 == cCompressionLevelFastest))
      goto code_r0x0010ca6d;
      if (uVar8 < 4) {
        uVar10 = 2;
      }
      else if (uVar8 < 8) {
        uVar10 = 2;
        if ((uVar9 & 2) != 0) {
          uVar10 = (uint)(cVar1 == cCompressionLevelUber) * 2 + 2;
        }
      }
      else {
        uVar10 = 4;
      }
    }
    this->m_num_parse_threads = uVar10;
  }
code_r0x0010ca6d:
  iVar7 = search_accelerator::init(&this->m_accel,(EVP_PKEY_CTX *)this);
  if ((char)iVar7 == '\0') {
    return 0;
  }
  CLZDecompBase::init_position_slots((CLZDecompBase *)this,*(uint *)(ctx + 0x10));
  CLZBase::init_slot_tabs(&this->super_CLZBase);
  iVar7 = state::init(&this->m_state,(EVP_PKEY_CTX *)this);
  if ((((char)iVar7 != '\0') &&
      (bVar12 = vector<unsigned_char>::try_reserve(&this->m_block_buf,(this->m_params).m_block_size)
      , bVar12)) &&
     (bVar12 = vector<unsigned_char>::try_reserve
                         (&this->m_comp_buf,(this->m_params).m_block_size * 2), bVar12)) {
    prVar6 = &this->m_parse_thread_state[0].super_raw_parse_thread_state;
    uVar11 = 0xffffffffffffffff;
    do {
      this_00 = &prVar6->m_approx_state;
      uVar11 = uVar11 + 1;
      bVar12 = this->m_num_parse_threads <= uVar11;
      uVar9 = (uint)bVar12;
      if (bVar12) {
        return uVar9;
      }
      prVar6 = (raw_parse_thread_state *)((long)(this_00 + 0x26) + 0x3e68);
      iVar7 = state::init(this_00,(EVP_PKEY_CTX *)this);
    } while ((char)iVar7 != '\0');
    return uVar9;
  }
  return 0;
}

Assistant:

bool lzcompressor::init(const init_params& params)
   {
      clear();

      if ((params.m_dict_size_log2 < CLZBase::cMinDictSizeLog2) || (params.m_dict_size_log2 > CLZBase::cMaxDictSizeLog2))
         return false;
      if ((params.m_compression_level < 0) || (params.m_compression_level > cCompressionLevelCount))
         return false;

      m_params = params;
      m_use_task_pool = (m_params.m_pTask_pool) && (m_params.m_pTask_pool->get_num_threads() != 0) && (m_params.m_max_helper_threads > 0);
      if ((m_params.m_max_helper_threads) && (!m_use_task_pool))
         return false;
      m_settings = s_settings[params.m_compression_level];

      if (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_FORCE_POLAR_CODING)
         m_settings.m_use_polar_codes = true;

      const uint dict_size = 1U << m_params.m_dict_size_log2;

      uint max_block_size = dict_size / 8;
      if (m_params.m_block_size > max_block_size)
      {
         m_params.m_block_size = max_block_size;
      }

      m_num_parse_threads = 1;

#if !LZHAM_FORCE_SINGLE_THREADED_PARSING
      if (params.m_max_helper_threads > 0)
      {
         LZHAM_ASSUME(cMaxParseThreads >= 4);

         if (m_params.m_block_size < 16384)
         {
            m_num_parse_threads = LZHAM_MIN(cMaxParseThreads, params.m_max_helper_threads + 1);
         }
         else
         {
            if ((params.m_max_helper_threads == 1) || (m_params.m_compression_level == cCompressionLevelFastest))
            {
               m_num_parse_threads = 1;
            }
            else if (params.m_max_helper_threads <= 3)
            {
               m_num_parse_threads = 2;
            }
            else if (params.m_max_helper_threads <= 7)
            {
               if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_EXTREME_PARSING) && (m_params.m_compression_level == cCompressionLevelUber))
                  m_num_parse_threads = 4;
               else
                  m_num_parse_threads = 2;
            }
            else
            {
               // 8-16
               m_num_parse_threads = 4;
            }
         }
      }
#endif

      int num_parse_jobs = m_num_parse_threads - 1;
      uint match_accel_helper_threads = LZHAM_MAX(0, (int)params.m_max_helper_threads - num_parse_jobs);

      LZHAM_ASSERT(m_num_parse_threads >= 1);
      LZHAM_ASSERT(m_num_parse_threads <= cMaxParseThreads);

      if (!m_use_task_pool)
      {
         LZHAM_ASSERT(!match_accel_helper_threads && (m_num_parse_threads == 1));
      }
      else
      {
         LZHAM_ASSERT((match_accel_helper_threads + (m_num_parse_threads - 1)) <= params.m_max_helper_threads);
      }

      if (!m_accel.init(this, params.m_pTask_pool, match_accel_helper_threads, dict_size, m_settings.m_match_accel_max_matches_per_probe, false, m_settings.m_match_accel_max_probes))
         return false;

      init_position_slots(params.m_dict_size_log2);
      init_slot_tabs();

      if (!m_state.init(*this, m_settings.m_fast_adaptive_huffman_updating, m_settings.m_use_polar_codes))
         return false;

      if (!m_block_buf.try_reserve(m_params.m_block_size))
         return false;

      if (!m_comp_buf.try_reserve(m_params.m_block_size*2))
         return false;

      for (uint i = 0; i < m_num_parse_threads; i++)
      {
         if (!m_parse_thread_state[i].m_approx_state.init(*this, m_settings.m_fast_adaptive_huffman_updating, m_settings.m_use_polar_codes))
            return false;
      }

      return true;
   }